

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O0

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::usage
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *this_00;
  bool bVar1;
  uint uVar2;
  czstring pcVar3;
  ostream *poVar4;
  string *psVar5;
  options_container *this_01;
  reference ppoVar6;
  option *op;
  iterator __end2;
  iterator __begin2;
  options_container *__range2;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *this_local;
  
  poVar4 = this->outs_;
  pcVar3 = stream_trait<char>::out_text("USAGE: ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  psVar5 = stream_trait<char>::out_string(&this->program_name_);
  std::operator<<(poVar4,(string *)psVar5);
  bVar1 = has_switches(this);
  if (bVar1) {
    poVar4 = this->outs_;
    pcVar3 = stream_trait<char>::out_text(" [options]");
    std::operator<<(poVar4,pcVar3);
  }
  this_01 = option::all_abi_cxx11_();
  __end2 = std::__cxx11::
           list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::
           begin(this_01);
  op = (option *)
       std::__cxx11::
       list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::end
                 (this_01);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&op), bVar1) {
    ppoVar6 = std::_List_iterator<pstore::command_line::option_*>::operator*(&__end2);
    this_00 = (help<std::basic_ostream<char,_std::char_traits<char>_>_> *)*ppoVar6;
    if ((this_00 != this) &&
       (uVar2 = (*(this_00->super_option)._vptr_option[9])(), (uVar2 & 1) != 0)) {
      poVar4 = this->outs_;
      pcVar3 = stream_trait<char>::out_text(" ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      psVar5 = option::usage_abi_cxx11_((option *)this_00);
      psVar5 = stream_trait<char>::out_string(psVar5);
      std::operator<<(poVar4,(string *)psVar5);
    }
    std::_List_iterator<pstore::command_line::option_*>::operator++(&__end2);
  }
  std::operator<<(this->outs_,'\n');
  return;
}

Assistant:

void help<OutputStream>::usage () const {
            outs_ << ostream_traits::out_text ("USAGE: ")
                  << ostream_traits::out_string (program_name_);
            if (this->has_switches ()) {
                outs_ << ostream_traits::out_text (" [options]");
            }
            for (option const * const op : option::all ()) {
                if (op != this && op->is_positional ()) {
                    outs_ << ostream_traits::out_text (" ")
                          << ostream_traits::out_string (op->usage ());
                }
            }
            outs_ << '\n';
        }